

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O0

void Sim_UtilAssignFromFifo(Sim_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  Sim_Pat_t *pPat_00;
  Abc_Obj_t *pAVar3;
  int local_5c;
  int Counter;
  int iEnd;
  int iBeg;
  int w;
  int i;
  int iWordLim;
  int iWord;
  int nWordsNew;
  uint *pSimInfo;
  Sim_Pat_t *pPat;
  Abc_Obj_t *pNode;
  int fUseOneWord;
  Sim_Man_t *p_local;
  
  i = 0;
  while( true ) {
    if (p->vFifo->nSize < 1) {
      return;
    }
    pPat_00 = (Sim_Pat_t *)Vec_PtrPop(p->vFifo);
    if (i + p->nSuppWords < p->nSimWords) {
      local_5c = i + p->nSuppWords;
    }
    else {
      local_5c = p->nSimWords;
    }
    for (iBeg = 0; iVar2 = Abc_NtkCiNum(p->pNtk), iBeg < iVar2; iBeg = iBeg + 1) {
      pAVar3 = Abc_NtkCi(p->pNtk,iBeg);
      pvVar1 = p->vSim0->pArray[pAVar3->Id];
      iVar2 = iBeg >> 5;
      if ((pPat_00->pData[iVar2] & 1 << ((byte)iBeg & 0x1f)) == 0) {
        for (iEnd = i; iEnd < local_5c; iEnd = iEnd + 1) {
          *(undefined4 *)((long)pvVar1 + (long)iEnd * 4) = 0;
        }
      }
      else {
        for (iEnd = i; iEnd < local_5c; iEnd = iEnd + 1) {
          *(undefined4 *)((long)pvVar1 + (long)iEnd * 4) = 0xffffffff;
        }
      }
      *(uint *)((long)pvVar1 + (long)iVar2 * 4 + (long)i * 4) =
           1 << ((byte)iBeg & 0x1f) ^ *(uint *)((long)pvVar1 + (long)iVar2 * 4 + (long)i * 4);
    }
    Sim_ManPatFree(p,pPat_00);
    if (local_5c == p->nSimWords) break;
    i = local_5c;
  }
  return;
}

Assistant:

void Sim_UtilAssignFromFifo( Sim_Man_t * p )
{
    int fUseOneWord = 0;
    Abc_Obj_t * pNode;
    Sim_Pat_t * pPat;
    unsigned * pSimInfo;
    int nWordsNew, iWord, iWordLim, i, w;
    int iBeg, iEnd;
    int Counter = 0;
    // go through the patterns and fill in the dist-1 minterms for each
    for ( iWord = 0; p->vFifo->nSize > 0; iWord = iWordLim )
    {
        ++Counter;
        // get the pattern
        pPat = (Sim_Pat_t *)Vec_PtrPop( p->vFifo );
        if ( fUseOneWord )
        {
            // get the first word of the next series
            iWordLim = iWord + 1; 
            // set the pattern for all PIs from iBit to iWord + p->nInputs
            iBeg = p->iInput;
            iEnd = Abc_MinInt( iBeg + 32, p->nInputs );
//            for ( i = iBeg; i < iEnd; i++ )
            Abc_NtkForEachCi( p->pNtk, pNode, i )
            {
                pNode = Abc_NtkCi(p->pNtk,i);
                pSimInfo = (unsigned *)p->vSim0->pArray[pNode->Id];
                if ( Sim_HasBit(pPat->pData, i) )
                    pSimInfo[iWord] = SIM_MASK_FULL;
                else
                    pSimInfo[iWord] = 0;
                // flip one bit
                if ( i >= iBeg && i < iEnd )
                    Sim_XorBit( pSimInfo + iWord, i-iBeg );
            }
        }
        else
        {
            // get the number of words for the remaining inputs
            nWordsNew = p->nSuppWords;
//            nWordsNew = SIM_NUM_WORDS( p->nInputs - p->iInput );
            // get the first word of the next series
            iWordLim = (iWord + nWordsNew < p->nSimWords)? iWord + nWordsNew : p->nSimWords; 
            // set the pattern for all CIs from iWord to iWord + nWordsNew
            Abc_NtkForEachCi( p->pNtk, pNode, i )
            {
                pSimInfo = (unsigned *)p->vSim0->pArray[pNode->Id];
                if ( Sim_HasBit(pPat->pData, i) )
                {
                    for ( w = iWord; w < iWordLim; w++ )
                        pSimInfo[w] = SIM_MASK_FULL;
                }
                else
                {
                    for ( w = iWord; w < iWordLim; w++ )
                        pSimInfo[w] = 0;
                }
                Sim_XorBit( pSimInfo + iWord, i );
                // flip one bit
//                if ( i >= p->iInput )
//                    Sim_XorBit( pSimInfo + iWord, i-p->iInput );
            }
        }
        Sim_ManPatFree( p, pPat );
        // stop if we ran out of room for patterns
        if ( iWordLim == p->nSimWords )
            break;
//        if ( Counter == 1 )
//            break;
    }
}